

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O1

void __thiscall OrderMoney::OrderMoney(OrderMoney *this,shared_ptr<const_Money> *a)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_45;
  int local_44;
  RealMoney *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (this->super_Money)._vptr_Money = (_func_int **)&PTR__OrderMoney_001202e8;
  (this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->a).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_44 = 0;
  (*((a->super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Money[3])
            (&local_30);
  local_40 = (RealMoney *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RealMoney,std::allocator<RealMoney>,int,std::__cxx11::string>
            (&local_38,&local_40,(allocator<RealMoney> *)&local_45,&local_44,&local_30);
  _Var2._M_pi = local_38._M_pi;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_40->super_Money;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->b).super___shared_ptr<const_Money,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  local_40 = (RealMoney *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

OrderMoney::OrderMoney(const shared_ptr<const Money> &a)
	: a(a), b(make_shared<RealMoney>(0, a->currency()))
{
}